

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::FunctionValidator::create(FunctionValidator *this)

{
  Module *wasm;
  ValidationInfo *info;
  FunctionValidator *this_00;
  long in_RSI;
  
  wasm = *(Module **)(in_RSI + 0x100);
  info = *(ValidationInfo **)(in_RSI + 0x108);
  this_00 = (FunctionValidator *)operator_new(0x228);
  FunctionValidator(this_00,wasm,info);
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<FunctionValidator>(*getModule(), &info);
  }